

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts5HashClear(Fts5Hash *pHash)

{
  Fts5HashEntry *pFVar1;
  Fts5HashEntry *p;
  int i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (pHash->nSlot <= lVar2) break;
    p = pHash->aSlot[lVar2];
    while (p != (Fts5HashEntry *)0x0) {
      pFVar1 = p->pHashNext;
      sqlite3_free(p);
      p = pFVar1;
    }
    lVar2 = lVar2 + 1;
  }
  memset(pHash->aSlot,0,(long)pHash->nSlot << 3);
  pHash->nEntry = 0;
  return;
}

Assistant:

static void sqlite3Fts5HashClear(Fts5Hash *pHash){
  int i;
  for(i=0; i<pHash->nSlot; i++){
    Fts5HashEntry *pNext;
    Fts5HashEntry *pSlot;
    for(pSlot=pHash->aSlot[i]; pSlot; pSlot=pNext){
      pNext = pSlot->pHashNext;
      sqlite3_free(pSlot);
    }
  }
  memset(pHash->aSlot, 0, pHash->nSlot * sizeof(Fts5HashEntry*));
  pHash->nEntry = 0;
}